

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestGeodesicArcIntersect.cpp
# Opt level: O2

bool ParseTestGeodesicArcIntersect(string *sString)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __a;
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  LLPoint intPtC1;
  LLPoint intPtC2;
  LLPoint geodesicStart;
  string sIntPt2Lat;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_4e8;
  string soTestId;
  string soIntersection1Lat;
  string soIntersection2Lon;
  string soIntersection2Lat;
  string soIntersection1Lon;
  LLPoint arcCenter;
  sregex_token_iterator it;
  string local_378;
  string soArcRadius;
  string soArcCenterLon;
  string soArcCenterLat;
  string soGeodesicAzimuth;
  string soGeodesicStartLon;
  string soGeodesicStartLat;
  int sub_matches [13];
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  double local_1e0;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  sregex_token_iterator s_end;
  LLPoint pt;
  
  trim(sString," \t\n\r\f\v");
  soTestId._M_dataplus._M_p = (pointer)&soTestId.field_2;
  soTestId._M_string_length = 0;
  soGeodesicStartLat._M_dataplus._M_p = (pointer)&soGeodesicStartLat.field_2;
  soGeodesicStartLat._M_string_length = 0;
  soTestId.field_2._M_local_buf[0] = '\0';
  soGeodesicStartLat.field_2._M_local_buf[0] = '\0';
  soGeodesicStartLon._M_dataplus._M_p = (pointer)&soGeodesicStartLon.field_2;
  soGeodesicStartLon._M_string_length = 0;
  soGeodesicAzimuth._M_dataplus._M_p = (pointer)&soGeodesicAzimuth.field_2;
  soGeodesicAzimuth._M_string_length = 0;
  soGeodesicStartLon.field_2._M_local_buf[0] = '\0';
  soGeodesicAzimuth.field_2._M_local_buf[0] = '\0';
  soArcCenterLat._M_dataplus._M_p = (pointer)&soArcCenterLat.field_2;
  soArcCenterLat._M_string_length = 0;
  soArcCenterLon._M_dataplus._M_p = (pointer)&soArcCenterLon.field_2;
  soArcCenterLon._M_string_length = 0;
  soArcCenterLat.field_2._M_local_buf[0] = '\0';
  soArcCenterLon.field_2._M_local_buf[0] = '\0';
  soArcRadius._M_dataplus._M_p = (pointer)&soArcRadius.field_2;
  soArcRadius._M_string_length = 0;
  soIntersection1Lat._M_dataplus._M_p = (pointer)&soIntersection1Lat.field_2;
  soIntersection1Lat._M_string_length = 0;
  soArcRadius.field_2._M_local_buf[0] = '\0';
  soIntersection1Lat.field_2._M_local_buf[0] = '\0';
  soIntersection1Lon._M_dataplus._M_p = (pointer)&soIntersection1Lon.field_2;
  soIntersection1Lon._M_string_length = 0;
  soIntersection2Lat._M_dataplus._M_p = (pointer)&soIntersection2Lat.field_2;
  soIntersection2Lat._M_string_length = 0;
  soIntersection1Lon.field_2._M_local_buf[0] = '\0';
  soIntersection2Lat.field_2._M_local_buf[0] = '\0';
  soIntersection2Lon._M_dataplus._M_p = (pointer)&soIntersection2Lon.field_2;
  soIntersection2Lon._M_string_length = 0;
  soIntersection2Lon.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&geodesicStart,"([a-z]*|[A-Z]*\\d*)[,]",(allocator *)&it);
  std::__cxx11::string::append((char *)&geodesicStart);
  std::__cxx11::string::append((char *)&geodesicStart);
  std::__cxx11::string::append((char *)&geodesicStart);
  std::__cxx11::string::append((char *)&geodesicStart);
  std::__cxx11::string::append((char *)&geodesicStart);
  std::__cxx11::string::append((char *)&geodesicStart);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&arcCenter,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&geodesicStart,
             0x11);
  sub_matches[8] = 9;
  sub_matches[9] = 10;
  sub_matches[10] = 0xb;
  sub_matches[0xb] = 0xc;
  sub_matches[4] = 5;
  sub_matches[5] = 6;
  sub_matches[6] = 7;
  sub_matches[7] = 8;
  sub_matches[0] = 1;
  sub_matches[1] = 2;
  sub_matches[2] = 3;
  sub_matches[3] = 4;
  sub_matches[0xc] = 0xd;
  __a._M_current = (sString->_M_dataplus)._M_p;
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<13ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)&it,__a,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__a._M_current + sString->_M_string_length),(regex_type *)&arcCenter,&sub_matches,0)
  ;
  s_end._M_suffix.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current._0_1_ = 0;
  s_end._M_suffix._9_8_ = 0;
  s_end._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  s_end._M_suffix.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current._0_1_ = 0;
  s_end._M_suffix.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current._1_7_ = 0;
  s_end._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  s_end._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  s_end._M_position._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  s_end._M_position._M_match._M_begin._M_current = (char *)0x0;
  s_end._M_position._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  s_end._M_position._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  s_end._M_position._M_pregex = (regex_type *)0x0;
  s_end._M_position._M_flags = 0;
  s_end._M_position._28_4_ = 0;
  s_end._M_position._M_begin._M_current = (char *)0x0;
  s_end._M_position._M_end._M_current = (char *)0x0;
  s_end._M_n = 0;
  s_end._M_result = (value_type *)0x0;
  s_end._M_has_m1 = false;
  bVar3 = std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator!=(&it,&s_end);
  if (bVar3) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sIntPt2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&intPtC1,local_4e8);
    std::__cxx11::string::operator=((string *)&soTestId,(string *)&intPtC1);
    std::__cxx11::string::~string((string *)&intPtC1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sIntPt2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sIntPt2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&intPtC1,local_4e8);
    std::__cxx11::string::operator=((string *)&soGeodesicStartLat,(string *)&intPtC1);
    std::__cxx11::string::~string((string *)&intPtC1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sIntPt2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sIntPt2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&intPtC1,local_4e8);
    std::__cxx11::string::operator=((string *)&soGeodesicStartLon,(string *)&intPtC1);
    std::__cxx11::string::~string((string *)&intPtC1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sIntPt2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sIntPt2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&intPtC1,local_4e8);
    std::__cxx11::string::operator=((string *)&soGeodesicAzimuth,(string *)&intPtC1);
    std::__cxx11::string::~string((string *)&intPtC1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sIntPt2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sIntPt2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&intPtC1,local_4e8);
    std::__cxx11::string::operator=((string *)&soArcCenterLat,(string *)&intPtC1);
    std::__cxx11::string::~string((string *)&intPtC1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sIntPt2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sIntPt2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&intPtC1,local_4e8);
    std::__cxx11::string::operator=((string *)&soArcCenterLon,(string *)&intPtC1);
    std::__cxx11::string::~string((string *)&intPtC1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sIntPt2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sIntPt2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&intPtC1,local_4e8);
    std::__cxx11::string::operator=((string *)&soArcRadius,(string *)&intPtC1);
    std::__cxx11::string::~string((string *)&intPtC1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sIntPt2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sIntPt2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&intPtC1,local_4e8);
    std::__cxx11::string::operator=((string *)&soIntersection1Lat,(string *)&intPtC1);
    std::__cxx11::string::~string((string *)&intPtC1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sIntPt2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sIntPt2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&intPtC1,local_4e8);
    std::__cxx11::string::operator=((string *)&soIntersection1Lon,(string *)&intPtC1);
    std::__cxx11::string::~string((string *)&intPtC1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sIntPt2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sIntPt2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&intPtC1,local_4e8);
    std::__cxx11::string::operator=((string *)&soIntersection2Lat,(string *)&intPtC1);
    std::__cxx11::string::~string((string *)&intPtC1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sIntPt2Lat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sIntPt2Lat,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&intPtC1,local_4e8);
    std::__cxx11::string::operator=((string *)&soIntersection2Lon,(string *)&intPtC1);
    std::__cxx11::string::~string((string *)&intPtC1);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sIntPt2Lat);
  }
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator(&s_end);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator(&it);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&arcCenter);
  std::__cxx11::string::~string((string *)&geodesicStart);
  std::__cxx11::string::string((string *)&local_d8,(string *)&soGeodesicStartLat);
  dVar1 = ParseLatitude(&local_d8);
  std::__cxx11::string::string((string *)&local_f8,(string *)&soGeodesicStartLon);
  dVar7 = ParseLongitude(&local_f8);
  geodesicStart.latitude = dVar1 * 0.017453292519943295;
  geodesicStart.longitude = dVar7 * 0.017453292519943295;
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_118,(string *)&soArcCenterLat);
  dVar1 = ParseLatitude(&local_118);
  std::__cxx11::string::string((string *)&local_138,(string *)&soArcCenterLon);
  dVar7 = ParseLongitude(&local_138);
  arcCenter.latitude = dVar1 * 0.017453292519943295;
  arcCenter.longitude = dVar7 * 0.017453292519943295;
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  dVar1 = atof(soGeodesicAzimuth._M_dataplus._M_p);
  dVar7 = atof(soArcRadius._M_dataplus._M_p);
  bVar3 = std::operator!=(&soIntersection1Lat,"N/A");
  if (bVar3) {
    std::__cxx11::string::string((string *)&local_158,(string *)&soIntersection1Lat);
    ParseLatitude(&local_158);
    std::__cxx11::string::string((string *)&local_178,(string *)&soIntersection1Lon);
    ParseLongitude(&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::string((string *)&local_198,(string *)&soIntersection2Lat);
    ParseLatitude(&local_198);
    std::__cxx11::string::string((string *)&local_1b8,(string *)&soIntersection2Lon);
    ParseLongitude(&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_198);
  }
  intPtC1.latitude = 0.0;
  intPtC1.longitude = 0.0;
  intPtC2.latitude = 0.0;
  intPtC2.longitude = 0.0;
  iVar4 = GeoCalcs::GeodesicArcIntercept
                    (&geodesicStart,dVar1 * 0.017453292519943295,&arcCenter,dVar7 * 1852.0,&intPtC1,
                     &intPtC2,1e-09);
  dVar1 = intPtC1.latitude;
  if (iVar4 < 1) {
    bVar3 = std::operator!=(&soIntersection1Lat,"N/A");
    bVar3 = !bVar3;
  }
  else {
    std::__cxx11::string::string((string *)&local_378,(string *)&soIntersection2Lat);
    dVar7 = ParseLatitude(&local_378);
    dVar2 = intPtC1.longitude;
    dVar6 = ABS(dVar1);
    dVar8 = ABS(dVar7 * 0.017453292519943295);
    if (dVar6 <= dVar8) {
      dVar8 = dVar6;
    }
    if (ABS(dVar1 - dVar7 * 0.017453292519943295) <= dVar8 * 0.0017453292519943296) {
      std::__cxx11::string::string((string *)&local_1d8,(string *)&soIntersection2Lon);
      dVar1 = ParseLongitude(&local_1d8);
      dVar8 = ABS(dVar2);
      dVar7 = ABS(dVar1 * 0.017453292519943295);
      if (dVar8 <= dVar7) {
        dVar7 = dVar8;
      }
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_378);
      dVar6 = intPtC1.longitude;
      dVar8 = intPtC1.latitude;
      if (ABS(dVar2 - dVar1 * 0.017453292519943295) <= dVar7 * 0.0017453292519943296) {
        intPtC1.latitude = intPtC2.latitude;
        intPtC1.longitude = intPtC2.longitude;
        intPtC2.latitude = dVar8;
        intPtC2.longitude = dVar6;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_378);
    }
    s_end._M_position._M_begin._M_current = (char *)(intPtC1.latitude * 57.29577951308232);
    ConvertLatitudeDdToDms_abi_cxx11_((string *)&it,(double *)&s_end);
    sIntPt2Lat._M_dataplus._M_p = (pointer)(intPtC1.longitude * 57.29577951308232);
    ConvertLongitudeDdToDms_abi_cxx11_((string *)&s_end,(double *)&sIntPt2Lat);
    sub_matches._0_8_ = intPtC2.latitude * 57.29577951308232;
    ConvertLatitudeDdToDms_abi_cxx11_(&sIntPt2Lat,(double *)sub_matches);
    local_1e0 = intPtC2.longitude * 57.29577951308232;
    ConvertLongitudeDdToDms_abi_cxx11_((string *)sub_matches,&local_1e0);
    iVar4 = std::__cxx11::string::compare((string *)&it);
    bVar3 = true;
    if (iVar4 != 0) {
      std::__cxx11::string::string((string *)&local_200,(string *)&soIntersection1Lat);
      dVar1 = ParseLatitude(&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      dVar8 = ABS(dVar1 * 0.017453292519943295);
      dVar7 = ABS(intPtC1.latitude);
      if (dVar8 <= ABS(intPtC1.latitude)) {
        dVar7 = dVar8;
      }
      if (ABS(dVar1 * 0.017453292519943295 - intPtC1.latitude) <= dVar7 * 1e-10) {
        poVar5 = std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&soTestId);
        poVar5 = std::operator<<(poVar5,
                                 " within rounding tolerance of 1e-10: Input Intersection 1 latitude: "
                                );
        poVar5 = std::operator<<(poVar5,(string *)&soIntersection1Lat);
        poVar5 = std::operator<<(poVar5,"  calced: ");
        std::operator<<(poVar5,(string *)&it);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&soTestId);
        poVar5 = std::operator<<(poVar5," failed: Expected Intersection 1 latitude: ");
        poVar5 = std::operator<<(poVar5,(string *)&soIntersection1Lat);
        poVar5 = std::operator<<(poVar5,"  calced: ");
        std::operator<<(poVar5,(string *)&it);
        bVar3 = false;
      }
    }
    iVar4 = std::__cxx11::string::compare((string *)&s_end);
    if (iVar4 != 0) {
      std::__cxx11::string::string((string *)&local_220,(string *)&soIntersection1Lon);
      dVar1 = ParseLatitude(&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      dVar8 = ABS(dVar1 * 0.017453292519943295);
      dVar7 = ABS(intPtC1.longitude);
      if (dVar8 <= ABS(intPtC1.longitude)) {
        dVar7 = dVar8;
      }
      if (ABS(dVar1 * 0.017453292519943295 - intPtC1.longitude) <= dVar7 * 1e-10) {
        poVar5 = std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&soTestId);
        poVar5 = std::operator<<(poVar5,
                                 " within rounding tolerance of 1e-10: Input Intersection 1 longitude: "
                                );
        poVar5 = std::operator<<(poVar5,(string *)&soIntersection1Lon);
        poVar5 = std::operator<<(poVar5,"  calced: ");
        std::operator<<(poVar5,(string *)&s_end);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&soTestId);
        poVar5 = std::operator<<(poVar5," failed: Expected Intersection 1 longitude: ");
        poVar5 = std::operator<<(poVar5,(string *)&soIntersection1Lon);
        poVar5 = std::operator<<(poVar5,"  calced: ");
        std::operator<<(poVar5,(string *)&s_end);
        bVar3 = false;
      }
    }
    iVar4 = std::__cxx11::string::compare((string *)&sIntPt2Lat);
    if (iVar4 != 0) {
      std::__cxx11::string::string((string *)&local_240,(string *)&soIntersection2Lat);
      dVar1 = ParseLatitude(&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      dVar8 = ABS(dVar1 * 0.017453292519943295);
      dVar7 = ABS(intPtC2.latitude);
      if (dVar8 <= ABS(intPtC2.latitude)) {
        dVar7 = dVar8;
      }
      if (ABS(dVar1 * 0.017453292519943295 - intPtC2.latitude) <= dVar7 * 1e-10) {
        poVar5 = std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&soTestId);
        poVar5 = std::operator<<(poVar5,
                                 " within rounding tolerance of 1e-10: Input Intersection 2 latitude: "
                                );
        poVar5 = std::operator<<(poVar5,(string *)&soIntersection2Lat);
        poVar5 = std::operator<<(poVar5,"  calced: ");
        std::operator<<(poVar5,(string *)&sIntPt2Lat);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&soTestId);
        poVar5 = std::operator<<(poVar5," failed: Expected Intersection 2 latitude: ");
        poVar5 = std::operator<<(poVar5,(string *)&soIntersection2Lat);
        poVar5 = std::operator<<(poVar5,"  calced: ");
        std::operator<<(poVar5,(string *)&sIntPt2Lat);
        bVar3 = false;
      }
    }
    iVar4 = std::__cxx11::string::compare((string *)sub_matches);
    if (iVar4 != 0) {
      std::__cxx11::string::string((string *)&local_260,(string *)&soIntersection2Lon);
      dVar1 = ParseLatitude(&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      dVar8 = ABS(dVar1 * 0.017453292519943295);
      dVar7 = ABS(intPtC2.longitude);
      if (dVar8 <= ABS(intPtC2.longitude)) {
        dVar7 = dVar8;
      }
      if (ABS(dVar1 * 0.017453292519943295 - intPtC2.longitude) <= dVar7 * 1e-10) {
        poVar5 = std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&soTestId);
        poVar5 = std::operator<<(poVar5,
                                 " within rounding tolerance of 1e-10: Input Intersection 2 longitude: "
                                );
        poVar5 = std::operator<<(poVar5,(string *)&soIntersection2Lon);
        poVar5 = std::operator<<(poVar5,"  calced: ");
        std::operator<<(poVar5,(string *)sub_matches);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&soTestId);
        poVar5 = std::operator<<(poVar5," failed: Expected Intersection 2 longitude: ");
        poVar5 = std::operator<<(poVar5,(string *)&soIntersection2Lon);
        poVar5 = std::operator<<(poVar5,"  calced: ");
        std::operator<<(poVar5,(string *)sub_matches);
        bVar3 = false;
      }
    }
    std::__cxx11::string::~string((string *)sub_matches);
    std::__cxx11::string::~string((string *)&sIntPt2Lat);
    std::__cxx11::string::~string((string *)&s_end);
    std::__cxx11::string::~string((string *)&it);
  }
  std::__cxx11::string::~string((string *)&soIntersection2Lon);
  std::__cxx11::string::~string((string *)&soIntersection2Lat);
  std::__cxx11::string::~string((string *)&soIntersection1Lon);
  std::__cxx11::string::~string((string *)&soIntersection1Lat);
  std::__cxx11::string::~string((string *)&soArcRadius);
  std::__cxx11::string::~string((string *)&soArcCenterLon);
  std::__cxx11::string::~string((string *)&soArcCenterLat);
  std::__cxx11::string::~string((string *)&soGeodesicAzimuth);
  std::__cxx11::string::~string((string *)&soGeodesicStartLon);
  std::__cxx11::string::~string((string *)&soGeodesicStartLat);
  std::__cxx11::string::~string((string *)&soTestId);
  return bVar3;
}

Assistant:

bool ParseTestGeodesicArcIntersect(string sString)
{
    bool bPassed = true;
    trim(sString);
    string soTestId, soGeodesicStartLat, soGeodesicStartLon;
    string soGeodesicAzimuth, soArcCenterLat, soArcCenterLon;
    string soArcRadius, soIntersection1Lat, soIntersection1Lon;
    string soIntersection2Lat, soIntersection2Lon;

    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-z]*|[A-Z]*\\d*)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])";

        regex pat(sRxPat, flags);

        int const sub_matches[] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13,};
        sregex_token_iterator it(sString.begin(), sString.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            soTestId = *it++;
            soGeodesicStartLat = *it++;
            soGeodesicStartLon = *it++;
            soGeodesicAzimuth = *it++;
            soArcCenterLat = *it++;
            soArcCenterLon = *it++;
            soArcRadius = *it++;
            soIntersection1Lat = *it++;
            soIntersection1Lon = *it++;
            soIntersection2Lat = *it++;
            soIntersection2Lon = *it++;

        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }

    LLPoint geodesicStart(Deg2Rad(ParseLatitude(soGeodesicStartLat)), Deg2Rad(ParseLongitude(soGeodesicStartLon)));
    LLPoint arcCenter(Deg2Rad(ParseLatitude(soArcCenterLat)), Deg2Rad(ParseLongitude(soArcCenterLon)));
    double geodesicAzimuth = Deg2Rad(atof(soGeodesicAzimuth.c_str()));
    double arcRadius = NmToMeters(atof(soArcRadius.c_str()));
    LLPoint intersection1;
    LLPoint intersection2;
    if (soIntersection1Lat != "N/A")
    {
        intersection1.Set(Deg2Rad(ParseLatitude(soIntersection1Lat)), Deg2Rad(ParseLongitude(soIntersection1Lon)));
        intersection2.Set(Deg2Rad(ParseLatitude(soIntersection2Lat)), Deg2Rad(ParseLongitude(soIntersection2Lon)));
    }

    LLPoint intPtC1, intPtC2;
    int nIndex = GeodesicArcIntercept(geodesicStart, geodesicAzimuth, arcCenter, arcRadius, intPtC1, intPtC2, kTol);
    if (nIndex < 1)
    {
        if (soIntersection1Lat != "N/A")
            bPassed = false;

    }
    else
    {
        if (IsApprox(intPtC1.latitude, Deg2Rad(ParseLatitude(soIntersection2Lat)), Deg2Rad(0.1)) &&
            IsApprox(intPtC1.longitude, Deg2Rad(ParseLongitude(soIntersection2Lon)), Deg2Rad(0.1)))
        {
            LLPoint pt = intPtC1;
            intPtC1 = intPtC2;
            intPtC2 = pt;
        }

        string sIntPt1Lat = ConvertLatitudeDdToDms(Rad2Deg(intPtC1.latitude));
        string sIntPt1Lon = ConvertLongitudeDdToDms(Rad2Deg(intPtC1.longitude));
        string sIntPt2Lat = ConvertLatitudeDdToDms(Rad2Deg(intPtC2.latitude));
        string sIntPt2Lon = ConvertLongitudeDdToDms(Rad2Deg(intPtC2.longitude));

        if (sIntPt1Lat.compare(soIntersection1Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(soIntersection1Lat));
            if (IsApprox(dLat, intPtC1.latitude, 1e-10))
            {
                cout << "\n" << soTestId << " within rounding tolerance of 1e-10: Input Intersection 1 latitude: " <<
                soIntersection1Lat << "  calced: " << sIntPt1Lat;
            }
            else
            {
                cout << "\n" << soTestId << " failed: Expected Intersection 1 latitude: " << soIntersection1Lat <<
                "  calced: " << sIntPt1Lat;
                bPassed = false;
            }
        }

        if (sIntPt1Lon.compare(soIntersection1Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLatitude(soIntersection1Lon));
            if (IsApprox(dLon, intPtC1.longitude, 1e-10))
            {
                cout << "\n" << soTestId << " within rounding tolerance of 1e-10: Input Intersection 1 longitude: " <<
                soIntersection1Lon << "  calced: " << sIntPt1Lon;
            }
            else
            {
                cout << "\n" << soTestId << " failed: Expected Intersection 1 longitude: " << soIntersection1Lon <<
                "  calced: " << sIntPt1Lon;
                bPassed = false;
            }
        }

        if (sIntPt2Lat.compare(soIntersection2Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(soIntersection2Lat));
            if (IsApprox(dLat, intPtC2.latitude, 1e-10))
            {
                cout << "\n" << soTestId << " within rounding tolerance of 1e-10: Input Intersection 2 latitude: " <<
                soIntersection2Lat << "  calced: " << sIntPt2Lat;
            }
            else
            {
                cout << "\n" << soTestId << " failed: Expected Intersection 2 latitude: " << soIntersection2Lat <<
                "  calced: " << sIntPt2Lat;
                bPassed = false;
            }
        }

        if (sIntPt2Lon.compare(soIntersection2Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLatitude(soIntersection2Lon));
            if (IsApprox(dLon, intPtC2.longitude, 1e-10))
            {
                cout << "\n" << soTestId << " within rounding tolerance of 1e-10: Input Intersection 2 longitude: " <<
                soIntersection2Lon << "  calced: " << sIntPt2Lon;
            }
            else
            {
                cout << "\n" << soTestId << " failed: Expected Intersection 2 longitude: " << soIntersection2Lon <<
                "  calced: " << sIntPt2Lon;
                bPassed = false;
            }
        }

    }


    return bPassed;
}